

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::reLoad(SPxSolverBase<double> *this)

{
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  (*(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase[8])(&this->super_SPxBasisBase<double>);
  (this->super_SPxBasisBase<double>).theLP = this;
  this->m_status = UNKNOWN;
  if (this->thepricer != (SPxPricer<double> *)0x0) {
    (*this->thepricer->_vptr_SPxPricer[2])();
  }
  if (this->theratiotester != (SPxRatioTester<double> *)0x0) {
    (*this->theratiotester->_vptr_SPxRatioTester[2])();
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::reLoad()
{
   forceRecompNonbasicValue();
   unInit();
   this->unLoad();
   this->theLP = this;
   m_status = SPxSolverBase<R>::UNKNOWN;

   if(thepricer)
      thepricer->clear();

   if(theratiotester)
      theratiotester->clear();
}